

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

void __thiscall
OpenMD::Field<double>::Field
          (Field<double> *this,SimInfo *info,string *filename,string *sele,RealType voxelSize)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *this_00;
  Snapshot *pSVar3;
  int *piVar4;
  reference pvVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  string *in_RCX;
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  RealType RVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  int j;
  int i;
  RealType Wc;
  RealType Wb;
  RealType Wa;
  Vector3d CxA;
  Vector3d BxC;
  Vector3d AxB;
  Vector3d C;
  Vector3d B;
  Vector3d A;
  Mat3x3d invBox;
  Mat3x3d box;
  int nSelected;
  Snapshot *in_stack_fffffffffffffb38;
  Snapshot *in_stack_fffffffffffffb40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb48;
  StaticAnalyser *in_stack_fffffffffffffb50;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffb58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb60;
  SelectionEvaluator *in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffb88;
  SelectionEvaluator *in_stack_fffffffffffffb90;
  Vector3<double> *in_stack_fffffffffffffba0;
  Vector3<double> *in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  SelectionEvaluator *in_stack_fffffffffffffc40;
  string local_370 [32];
  string local_350 [32];
  undefined8 local_330;
  double *local_328;
  double *local_320;
  undefined8 local_318;
  double *local_310;
  double *local_308;
  int local_300;
  int local_2fc;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  undefined1 local_280 [48];
  undefined1 local_250 [48];
  undefined1 local_220 [8];
  SimInfo *in_stack_fffffffffffffde8;
  SelectionManager *in_stack_fffffffffffffdf0;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffb50,(SimInfo *)in_stack_fffffffffffffb48._M_current,
             (string *)in_stack_fffffffffffffb40,(uint)((ulong)in_stack_fffffffffffffb38 >> 0x20));
  *in_RDI = &PTR__Field_0055f7c0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),in_RCX);
  SelectionManager::SelectionManager(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  SelectionEvaluator::SelectionEvaluator
            (in_stack_fffffffffffffc40,
             (SimInfo *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
  in_RDI[0xe5] = in_XMM0_Qa;
  Vector3<int>::Vector3((Vector3<int> *)0x17313b);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)0x173159);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)0x173175);
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x38));
  if (!bVar1) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffb78);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffb50,
               (SelectionSet *)in_stack_fffffffffffffb48._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x173214);
  }
  iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x1732d0);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1732f4);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x173303);
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x17332d);
  *(bool *)(in_RDI + 0xe2) = bVar1;
  if ((*(byte *)(in_RDI + 0xe2) & 1) == 0) {
    Snapshot::getBoundingBox(in_stack_fffffffffffffb38);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb40,
               (SquareMatrix3<double> *)in_stack_fffffffffffffb38);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x17339d);
    Snapshot::getInvBoundingBox(in_stack_fffffffffffffb38);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb40,
               (SquareMatrix3<double> *)in_stack_fffffffffffffb38);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1733df);
  }
  else {
    Snapshot::getHmat(in_stack_fffffffffffffb38);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb40,
               (SquareMatrix3<double> *)in_stack_fffffffffffffb38);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1734a4);
    Snapshot::getInvHmat(in_stack_fffffffffffffb38);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb40,
               (SquareMatrix3<double> *)in_stack_fffffffffffffb38);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1734e6);
  }
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
  pSVar3 = SnapshotManager::getCurrentSnapshot(this_00);
  in_RDI[0x19] = pSVar3;
  if (iVar2 == 0) {
    in_RDI[0xe4] = in_XMM0_Qa * 2.0;
  }
  else {
    RVar6 = Snapshot::getVolume(in_stack_fffffffffffffb40);
    dVar7 = pow(RVar6 / (double)iVar2,0.3333333333333333);
    in_RDI[0xe4] = dVar7;
  }
  in_RDI[0xe3] = (double)in_RDI[0xe4] * 3.0;
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffb58,(uint)((ulong)in_stack_fffffffffffffb50 >> 0x20));
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffb40,
             (Vector<double,_3U> *)in_stack_fffffffffffffb38);
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffb58,(uint)((ulong)in_stack_fffffffffffffb50 >> 0x20));
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffb40,
             (Vector<double,_3U> *)in_stack_fffffffffffffb38);
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffb58,(uint)((ulong)in_stack_fffffffffffffb50 >> 0x20));
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffb40,
             (Vector<double,_3U> *)in_stack_fffffffffffffb38);
  cross<double>(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  cross<double>(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  cross<double>(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffb40);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffb40);
  Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffb40);
  iVar2 = (int)local_220;
  dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffb50,
                 (Vector<double,_3U> *)in_stack_fffffffffffffb48._M_current);
  std::abs(iVar2);
  iVar2 = (int)local_250;
  local_2e8 = extraout_XMM0_Qa;
  dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffb50,
                 (Vector<double,_3U> *)in_stack_fffffffffffffb48._M_current);
  std::abs(iVar2);
  iVar2 = (int)local_280;
  local_2f0 = extraout_XMM0_Qa_00;
  dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffb50,
                 (Vector<double,_3U> *)in_stack_fffffffffffffb48._M_current);
  std::abs(iVar2);
  dVar7 = (double)in_RDI[0xe5];
  local_2f8 = extraout_XMM0_Qa_01;
  piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0xe6));
  *piVar4 = (int)(local_2e8 / dVar7);
  dVar7 = (double)in_RDI[0xe5];
  piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0xe6));
  *piVar4 = (int)(local_2f0 / dVar7);
  dVar7 = (double)in_RDI[0xe5];
  piVar4 = Vector3<int>::z((Vector3<int> *)(in_RDI + 0xe6));
  *piVar4 = (int)(local_2f8 / dVar7);
  Vector3<int>::x((Vector3<int> *)(in_RDI + 0xe6));
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)in_stack_fffffffffffffb60,(size_type)in_stack_fffffffffffffb58);
  Vector3<int>::x((Vector3<int> *)(in_RDI + 0xe6));
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)in_stack_fffffffffffffb60,(size_type)in_stack_fffffffffffffb58);
  local_2fc = 0;
  while( true ) {
    iVar2 = local_2fc;
    piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0xe6));
    if (*piVar4 <= iVar2) break;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  *)(in_RDI + 0xeb),(long)local_2fc);
    Vector3<int>::y((Vector3<int> *)(in_RDI + 0xe6));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffb60,(size_type)in_stack_fffffffffffffb58);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  *)(in_RDI + 0xe8),(long)local_2fc);
    Vector3<int>::y((Vector3<int> *)(in_RDI + 0xe6));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffb60,(size_type)in_stack_fffffffffffffb58);
    local_300 = 0;
    while( true ) {
      iVar2 = local_300;
      piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0xe6));
      if (*piVar4 <= iVar2) break;
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0xeb),(long)local_2fc);
      in_stack_fffffffffffffb58 =
           (RectMatrix<double,_3U,_3U> *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](pvVar5,(long)local_300);
      in_stack_fffffffffffffb60 =
           (vector<double,_std::allocator<double>_> *)
           Vector3<int>::z((Vector3<int> *)(in_RDI + 0xe6));
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffb60,(size_type)in_stack_fffffffffffffb58);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0xe8),(long)local_2fc);
      in_stack_fffffffffffffb48._M_current =
           (double *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](pvVar5,(long)local_300);
      __first._M_current = (double *)Vector3<int>::z((Vector3<int> *)(in_RDI + 0xe6));
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffb60,(size_type)in_stack_fffffffffffffb58);
      in_stack_fffffffffffffb40 = (Snapshot *)(in_RDI + 0xe8);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffb40,(long)local_2fc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_300);
      local_308 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb38);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffb40,(long)local_2fc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_300);
      local_310 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb38);
      local_318 = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,in_stack_fffffffffffffb48,(double *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb38 = (Snapshot *)(in_RDI + 0xeb);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffb38,(long)local_2fc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_300);
      local_320 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb38);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)in_stack_fffffffffffffb38,(long)local_2fc);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar5,(long)local_300);
      local_328 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb38);
      local_330 = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,in_stack_fffffffffffffb48,(double *)in_stack_fffffffffffffb40);
      local_300 = local_300 + 1;
    }
    local_2fc = local_2fc + 1;
  }
  getPrefix((string *)in_stack_fffffffffffffb48._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48._M_current,(char *)in_stack_fffffffffffffb40);
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)in_stack_fffffffffffffb40,(string *)in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_370);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x173d46);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x173d53);
  return;
}

Assistant:

Field<T>::Field(SimInfo* info, const std::string& filename,
                  const std::string& sele, RealType voxelSize) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), seleMan_(info), evaluator_(info),
      voxelSize_(voxelSize) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    int nSelected = seleMan_.getSelectionCount();

    Mat3x3d box;
    Mat3x3d invBox;

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    // reff will be used in the gaussian weighting of the
    // should be based on r_{effective}
    snap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (nSelected == 0) {
      reffective_ = 2.0 * voxelSize;
    } else {
      reffective_ = pow((snap_->getVolume() / nSelected), 1. / 3.);
    }
    rcut_ = 3.0 * reffective_;

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nBins_.x() = int(Wa / voxelSize_);
    nBins_.y() = int(Wb / voxelSize_);
    nBins_.z() = int(Wc / voxelSize_);

    // Build the field histogram and dens histogram and fill with zeros.
    field_.resize(nBins_.x());
    dens_.resize(nBins_.x());
    for (int i = 0; i < nBins_.x(); ++i) {
      field_[i].resize(nBins_.y());
      dens_[i].resize(nBins_.y());
      for (int j = 0; j < nBins_.y(); ++j) {
        field_[i][j].resize(nBins_.z());
        dens_[i][j].resize(nBins_.z());

        std::fill(dens_[i][j].begin(), dens_[i][j].end(), 0.0);
        std::fill(field_[i][j].begin(), field_[i][j].end(), T(0.0));
      }
    }

    setOutputName(getPrefix(filename) + ".field");
  }